

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmatrix.cc
# Opt level: O3

void __thiscall fasttext::QMatrix::quantize(QMatrix *this,Matrix *matrix)

{
  pointer x;
  Vector norms;
  Matrix temp;
  Vector local_58;
  Matrix local_40;
  
  if (this->m_ != matrix->m_) {
    __assert_fail("m_ == matrix.size(0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/qmatrix.cc"
                  ,0x29,"void fasttext::QMatrix::quantize(const Matrix &)");
  }
  if (this->n_ == matrix->n_) {
    std::vector<float,_std::allocator<float>_>::vector(&local_40.data_,&matrix->data_);
    local_40.m_ = matrix->m_;
    local_40.n_ = matrix->n_;
    if (this->qnorm_ == true) {
      Vector::Vector(&local_58,local_40.m_);
      Matrix::l2NormRow(&local_40,&local_58);
      Matrix::divideRow(&local_40,&local_58,0,-1);
      quantizeNorm(this,&local_58);
      if (local_58.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    x = local_40.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start;
    ProductQuantizer::train
              ((this->pq_)._M_t.
               super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
               ._M_t.
               super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
               .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl,
               (int32_t)this->m_,
               local_40.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
    ProductQuantizer::compute_codes
              ((this->pq_)._M_t.
               super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
               ._M_t.
               super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
               .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl,x,
               (this->codes_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,(int32_t)this->m_);
    if (local_40.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (real *)0x0) {
      operator_delete(local_40.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return;
  }
  __assert_fail("n_ == matrix.size(1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/qmatrix.cc"
                ,0x2a,"void fasttext::QMatrix::quantize(const Matrix &)");
}

Assistant:

void QMatrix::quantize(const Matrix& matrix) {
  assert(m_ == matrix.size(0));
  assert(n_ == matrix.size(1));
  Matrix temp(matrix);
  if (qnorm_) {
    Vector norms(temp.size(0));
    temp.l2NormRow(norms);
    temp.divideRow(norms);
    quantizeNorm(norms);
  }
  auto dataptr = temp.data();
  pq_->train(m_, dataptr);
  pq_->compute_codes(dataptr, codes_.data(), m_);
}